

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gauden.c
# Opt level: O0

void gauden_tie_fullvars_dnoms
               (vector_t ****wt_fullvar,int32 pass2var,float32 ***dnom,vector_t ***mean,
               uint32 n_mgau,uint32 n_feat,uint32 n_density,uint32 *veclen)

{
  uint local_44;
  uint local_40;
  uint32 ll;
  uint32 l;
  uint32 k;
  uint32 j;
  uint32 i;
  uint32 n_feat_local;
  uint32 n_mgau_local;
  vector_t ***mean_local;
  float32 ***dnom_local;
  int32 pass2var_local;
  vector_t ****wt_fullvar_local;
  
  for (l = 0; l < n_feat; l = l + 1) {
    if (pass2var == 0) {
      for (local_40 = 0; local_40 < veclen[l]; local_40 = local_40 + 1) {
        (*(*mean)[l])[local_40] = (float)*(*dnom)[l] * (*(*mean)[l])[local_40];
      }
    }
    for (ll = 1; ll < n_density; ll = ll + 1) {
      for (local_40 = 0; local_40 < veclen[l]; local_40 = local_40 + 1) {
        for (local_44 = 0; local_44 < veclen[l]; local_44 = local_44 + 1) {
          (*(*wt_fullvar)[l])[local_40][local_44] =
               (*wt_fullvar)[l][ll][local_40][local_44] + (*(*wt_fullvar)[l])[local_40][local_44];
        }
        if (pass2var == 0) {
          (*(*mean)[l])[local_40] =
               (*mean)[l][ll][local_40] * (float)(*dnom)[l][ll] + (*(*mean)[l])[local_40];
        }
      }
      *(*dnom)[l] = (float32)((float)(*dnom)[l][ll] + (float)*(*dnom)[l]);
    }
  }
  for (k = 1; k < n_mgau; k = k + 1) {
    for (l = 0; l < n_feat; l = l + 1) {
      for (ll = 0; ll < n_density; ll = ll + 1) {
        for (local_40 = 0; local_40 < veclen[l]; local_40 = local_40 + 1) {
          for (local_44 = 0; local_44 < veclen[l]; local_44 = local_44 + 1) {
            (*(*wt_fullvar)[l])[local_40][local_44] =
                 wt_fullvar[k][l][ll][local_40][local_44] + (*(*wt_fullvar)[l])[local_40][local_44];
          }
          if (pass2var == 0) {
            (*(*mean)[l])[local_40] =
                 mean[k][l][ll][local_40] * (float)dnom[k][l][ll] + (*(*mean)[l])[local_40];
          }
        }
        *(*dnom)[l] = (float32)((float)dnom[k][l][ll] + (float)*(*dnom)[l]);
      }
    }
  }
  for (k = 0; k < n_mgau; k = k + 1) {
    for (l = 0; l < n_feat; l = l + 1) {
      for (ll = 0; ll < n_density; ll = ll + 1) {
        for (local_40 = 0; local_40 < veclen[l]; local_40 = local_40 + 1) {
          if (pass2var == 0) {
            if ((k == 0) && (ll == 0)) {
              (*(*mean)[l])[local_40] = (*(*mean)[l])[local_40] / (float)*(*dnom)[l];
            }
            else {
              mean[k][l][ll][local_40] = (*(*mean)[l])[local_40];
            }
          }
          for (local_44 = 0; local_44 < veclen[l]; local_44 = local_44 + 1) {
            wt_fullvar[k][l][ll][local_40][local_44] = (*(*wt_fullvar)[l])[local_40][local_44];
          }
        }
        dnom[k][l][ll] = *(*dnom)[l];
      }
    }
  }
  return;
}

Assistant:

static void
gauden_tie_fullvars_dnoms(vector_t ****wt_fullvar,
			  int32 pass2var,
			  float32 ***dnom,
			  vector_t ***mean,
			  uint32 n_mgau,
			  uint32 n_feat,
			  uint32 n_density,
			  const uint32 *veclen)
{
    uint32 i, j, k, l, ll;

    /* Tie all variances and dnoms together. */
    /* First accumulate first codebook */
    for (j = 0; j < n_feat; j++) {
	if (!pass2var) {
	    /* Unnormalize first mean */
	    for (l = 0; l < veclen[j]; l++) {
		mean[0][j][0][l] *= dnom[0][j][0];
	    }
	}
	for (k = 1; k < n_density; k++) {
	    for (l = 0; l < veclen[j]; l++) {
		for (ll = 0; ll < veclen[j]; ll++) {
		    wt_fullvar[0][j][0][l][ll] += wt_fullvar[0][j][k][l][ll];
		}
		if (!pass2var) {
		    /* Accumulate unnormalized means */
		    mean[0][j][0][l] += mean[0][j][k][l] * dnom[0][j][k];
		}
	    }
	    dnom[0][j][0] += dnom[0][j][k];
	}
    }
    /* Now add other codebooks to it */
    for (i = 1; i < n_mgau; i++) {
	for (j = 0; j < n_feat; j++) {
	    for (k = 0; k < n_density; k++) {
		for (l = 0; l < veclen[j]; l++) {
		    for (ll = 0; ll < veclen[j]; ll++) {
			wt_fullvar[0][j][0][l][ll] += wt_fullvar[i][j][k][l][ll];
		    }
		    if (!pass2var) {
			mean[0][j][0][l] += mean[i][j][k][l] * dnom[i][j][k];
		    }
		}
		dnom[0][j][0] += dnom[i][j][k];
	    }
	}
    }
    /* Now spread everything around */
    for (i = 0; i < n_mgau; i++) {
	for (j = 0; j < n_feat; j++) {
	    for (k = 0; k < n_density; k++) {
		for (l = 0; l < veclen[j]; l++) {
		    if (!pass2var) {
			if (i == 0 && k == 0) /* Renormalize global mean */
			    mean[i][j][k][l] /= dnom[i][j][k];
			else
			    mean[i][j][k][l] = mean[0][j][0][l];
		    }
		    for (ll = 0; ll < veclen[j]; ll++) {
			wt_fullvar[i][j][k][l][ll] = wt_fullvar[0][j][0][l][ll];
		    }
		}
		dnom[i][j][k] = dnom[0][j][0];
	    }
	}
    }
}